

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  vec3f light_dir;
  allocator<char> local_199;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  TGAImage image;
  string local_150;
  string local_130;
  Model model;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"obj/african_head.obj",(allocator<char> *)&image);
  Model::Model(&model,&local_130,true,false,false);
  std::__cxx11::string::~string((string *)&local_130);
  TGAImage::TGAImage(&image,600,600,3);
  local_198 = 0;
  uStack_190 = 0;
  local_188 = 0xbff0000000000000;
  light_dir.z = -1.0;
  light_dir.x = 0.0;
  light_dir.y = 0.0;
  lambert_textured_lighting(light_dir,&model,&image);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"output.tga",&local_199);
  TGAImage::write_tga_file(&image,&local_150,true,true);
  std::__cxx11::string::~string((string *)&local_150);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&image);
  Model::~Model(&model);
  return 0;
}

Assistant:

int main()
{
    Model model{"obj/african_head.obj", true, false, false};
    TGAImage image(width, height, TGAImage::RGB);
    vec3f light_dir{0, 0, -1};
    // lambert_lighting(light_dir, model, image);
    // random_colors(model, image);
    lambert_textured_lighting(light_dir, model, image);
    image.write_tga_file("output.tga");
    return 0;
}